

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O3

void __thiscall Parser::memberDecl(Parser *this,ptr<ObjectExpression> *descriptor)

{
  TokenType *pTVar1;
  bool bVar2;
  undefined8 extraout_RAX;
  Scope scope;
  Scope SVar3;
  TokenType *pTVar4;
  initializer_list<TokenType> __l;
  allocator_type local_59;
  vector<TokenType,_std::allocator<TokenType>_> local_58;
  TokenType local_3c [3];
  
  bVar2 = match(this,Public);
  SVar3 = Public;
  if (!bVar2) {
    bVar2 = match(this,Private);
    SVar3 = Private;
    scope = Public;
    if (!bVar2) goto LAB_0010cf27;
  }
  consume(this);
  scope = SVar3;
LAB_0010cf27:
  local_3c[0] = Let;
  local_3c[1] = Const;
  local_3c[2] = 0x30;
  __l._M_len = 3;
  __l._M_array = local_3c;
  std::vector<TokenType,_std::allocator<TokenType>_>::vector(&local_58,__l,&local_59);
  pTVar1 = local_58.super__Vector_base<TokenType,_std::allocator<TokenType>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (local_58.super__Vector_base<TokenType,_std::allocator<TokenType>_>._M_impl.
      super__Vector_impl_data._M_start ==
      local_58.super__Vector_base<TokenType,_std::allocator<TokenType>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    bVar2 = false;
  }
  else {
    do {
      pTVar4 = pTVar1 + 1;
      bVar2 = match(this,*pTVar1);
      pTVar1 = pTVar4;
    } while (pTVar4 != local_58.super__Vector_base<TokenType,_std::allocator<TokenType>_>._M_impl.
                       super__Vector_impl_data._M_finish && !bVar2);
  }
  if (local_58.super__Vector_base<TokenType,_std::allocator<TokenType>_>._M_impl.
      super__Vector_impl_data._M_start != (TokenType *)0x0) {
    operator_delete(local_58.super__Vector_base<TokenType,_std::allocator<TokenType>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_58.super__Vector_base<TokenType,_std::allocator<TokenType>_>._M_impl
                          .super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.super__Vector_base<TokenType,_std::allocator<TokenType>_>._M_impl
                          .super__Vector_impl_data._M_start);
  }
  if (bVar2 == false) {
    bVar2 = match(this,Function);
    if (!bVar2) {
      unexpected(this);
      if (local_58.super__Vector_base<TokenType,_std::allocator<TokenType>_>._M_impl.
          super__Vector_impl_data._M_start != (TokenType *)0x0) {
        operator_delete(local_58.super__Vector_base<TokenType,_std::allocator<TokenType>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_58.super__Vector_base<TokenType,_std::allocator<TokenType>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_58.super__Vector_base<TokenType,_std::allocator<TokenType>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      _Unwind_Resume(extraout_RAX);
    }
    method(this,descriptor,scope);
  }
  else {
    attributeDecl(this,descriptor,scope);
  }
  return;
}

Assistant:

void Parser::memberDecl(ptr<ObjectExpression> &descriptor) {
    Scope scope = Scope::Public;

    if(match(TokenType::Public)) {
        consume();
    } else if(match(TokenType::Private)) {
        scope = Scope::Private;
        consume();
    }

    if(matchAny({ TokenType::Let, TokenType::Const, TokenType::Identifier }))
        attributeDecl(descriptor, scope);
    else if(match(TokenType::Function))
        method(descriptor, scope);
    else {
        unexpected();
    }
}